

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O1

char * lws_sql_purify(char *escaped,char *string,size_t len)

{
  char *pcVar1;
  char *p;
  char *pcVar2;
  char cVar3;
  char *q;
  
  pcVar1 = escaped;
  cVar3 = *string;
  if (cVar3 != '\0') {
    pcVar2 = string + 1;
    do {
      if (len < 3) break;
      if (cVar3 == '\'') {
        escaped[0] = '\'';
        escaped[1] = '\'';
        escaped = escaped + 2;
        len = len - 2;
      }
      else {
        len = len - 1;
        *escaped = cVar3;
        escaped = escaped + 1;
      }
      cVar3 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar3 != '\0');
  }
  *escaped = '\0';
  return pcVar1;
}

Assistant:

const char *
lws_sql_purify(char *escaped, const char *string, size_t len)
{
	const char *p = string;
	char *q = escaped;

	while (*p && len-- > 2) {
		if (*p == '\'') {
			*q++ = '\'';
			*q++ = '\'';
			len --;
			p++;
		} else
			*q++ = *p++;
	}
	*q = '\0';

	return escaped;
}